

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

void kratos::LatchVisitor::check_stmt_block
               (StmtBlock *stmt,Var *var,
               vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *stmts,bool full_branch)

{
  bool bVar1;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  format_args args;
  string_view format_str;
  const_iterator local_80;
  const_iterator local_78;
  undefined8 uStack_70;
  Stmt **local_60;
  undefined8 uStack_58;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_40._9_7_ = 0;
  local_40._M_pod_data[8] = full_branch;
  local_28 = std::
             _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:550:22)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<bool_(kratos::Stmt_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/src/analysis.cc:550:22)>
             ::_M_manager;
  local_40._M_unused._M_object = var;
  bVar1 = check_stmt_condition
                    (&stmt->super_Stmt,(function<bool_(kratos::Stmt_*)> *)&local_40,false,
                     full_branch);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,3);
  }
  if (bVar1) {
    return;
  }
  this = (StmtException *)__cxa_allocate_exception(0x10);
  (*(var->super_IRNode)._vptr_IRNode[0x1f])(&local_60,var);
  local_78._M_current = local_60;
  uStack_70 = uStack_58;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x1d;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)&local_40,(detail *)"{0} will be inferred as latch",format_str,args);
  local_78._M_current =
       (stmts->super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_80._M_current =
       (stmts->super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  StmtException::StmtException(this,(string *)&local_40,&local_78,&local_80);
  __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static void check_stmt_block(StmtBlock* stmt, Var* var, const std::vector<Stmt*>& stmts,
                                 bool full_branch) {
        auto check = [=](Stmt* s) -> bool {
            if (s->type() == StatementType::Assign) {
                auto* assign = reinterpret_cast<AssignStmt*>(s);
                auto* left = assign->left();
                if (left->type() == VarType::Slice) {
                    auto* slice = reinterpret_cast<VarSlice*>(left);
                    left = const_cast<Var*>(slice->get_var_root_parent());
                }
                return left == var;
            } else if (s->type() == StatementType::Block) {
                auto* block = reinterpret_cast<StmtBlock*>(s);
                if (block->block_type() == StatementBlockType::Function) {
                    // function call to set the variable
                    return check_stmt_block(block, var, full_branch);
                }
            }
            return false;
        };
        if (!check_stmt_condition(stmt, check, false, full_branch)) {
            // things goes wrong
            // need to recover all the statements
            throw StmtException(::format("{0} will be inferred as latch", var->to_string()),
                                stmts.begin(), stmts.end());
        }
    }